

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O2

string * __thiscall
ZXing::Content::render_abi_cxx11_(string *__return_storage_ptr__,Content *this,bool withECI)

{
  ulong uVar1;
  byte bVar2;
  pointer pEVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  CharacterSet fallbackCS;
  bool withECI_local;
  ECI lastECI;
  undefined1 local_50 [32];
  Content *local_30;
  
  if (((this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     (withECI_local = withECI, bVar4 = canProcess(this), !bVar4)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (withECI) {
    SymbologyIdentifier::toString_abi_cxx11_((string *)local_50,&this->symbology,true);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  lastECI = Unknown;
  fallbackCS = this->defaultCharset;
  bVar2 = this->hasECI;
  if (fallbackCS == Unknown && (bool)bVar2 == false) {
    fallbackCS = guessEncoding(this);
    bVar2 = this->hasECI;
  }
  local_50._0_8_ = &fallbackCS;
  local_50._8_8_ = &withECI_local;
  local_50._16_8_ = &lastECI;
  pEVar3 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_50._24_8_ = __return_storage_ptr__;
  local_30 = this;
  if (pEVar3 == (this->encodings).
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar6 = *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
            *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  else {
    iVar6 = pEVar3->pos;
    if (iVar6 == 0) goto LAB_0014ebdf;
  }
  render::anon_class_40_5_a4efd04e::operator()
            ((anon_class_40_5_a4efd04e *)local_50,(bVar2 & 1) + Unknown | ISO8859_1,0,iVar6);
LAB_0014ebdf:
  uVar1 = 0;
  while( true ) {
    uVar5 = uVar1;
    pEVar3 = (this->encodings).
             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (ulong)((long)(this->encodings).
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3) >> 3;
    if ((long)(int)uVar7 <= (long)uVar5) break;
    uVar1 = uVar5 + 1;
    if (uVar1 == (uVar7 & 0xffffffff)) {
      iVar6 = *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
              *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
    }
    else {
      iVar6 = pEVar3[uVar5 + 1].pos;
    }
    if (pEVar3[uVar5].pos != iVar6) {
      render::anon_class_40_5_a4efd04e::operator()
                ((anon_class_40_5_a4efd04e *)local_50,pEVar3[uVar5].eci,pEVar3[uVar5].pos,iVar6);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Content::render(bool withECI) const
{
	if (empty() || !canProcess())
		return {};

	std::string res;
	if (withECI)
		res = symbology.toString(true);
	ECI lastECI = ECI::Unknown;
	auto fallbackCS = defaultCharset;
	if (!hasECI && fallbackCS == CharacterSet::Unknown)
		fallbackCS = guessEncoding();

	ForEachECIBlock([&](ECI eci, int begin, int end) {
		// first determine how to decode the content (choose character set)
		//  * eci == ECI::Unknown implies !hasECI and we guess
		//  * if !IsText(eci) the ToCharcterSet(eci) will return Unknown and we decode as binary
		CharacterSet cs = eci == ECI::Unknown ? fallbackCS : ToCharacterSet(eci);

		if (withECI) {
			// then find the eci to report back in the ECI designator
			if (IsText(ToECI(cs))) // everything decoded as text is reported as utf8
				eci = ECI::UTF8;
			else if (eci == ECI::Unknown) // implies !hasECI and fallbackCS is Unknown or Binary
				eci = ECI::Binary;

			if (lastECI != eci)
				res += ToString(eci);
			lastECI = eci;

			std::string tmp;
			TextDecoder::Append(tmp, bytes.data() + begin, end - begin, cs);
			for (auto c : tmp) {
				res += c;
				if (c == '\\') // in the ECI protocol a '\' has to be doubled
					res += c;
			}
		} else {
			TextDecoder::Append(res, bytes.data() + begin, end - begin, cs);
		}
	});

	return res;
}